

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.h
# Opt level: O3

bool __thiscall
jrtplib::RTPFakeTransmitter::ShouldAcceptData
          (RTPFakeTransmitter *this,uint32_t srcip,uint16_t srcport)

{
  list<unsigned_short,_std::allocator<unsigned_short>_> *plVar1;
  ReceiveMode RVar2;
  HashElement *pHVar3;
  _List_node_base *p_Var4;
  bool bVar5;
  
  RVar2 = this->receivemode;
  pHVar3 = (this->acceptignoreinfo).table[srcip % 0x207d];
  (this->acceptignoreinfo).curhashelem = pHVar3;
  if (RVar2 != AcceptSome) {
    while( true ) {
      if (pHVar3 == (HashElement *)0x0) {
        return true;
      }
      if (pHVar3->key == srcip) break;
      pHVar3 = pHVar3->hashnext;
      (this->acceptignoreinfo).curhashelem = pHVar3;
    }
    plVar1 = &pHVar3->element->portlist;
    p_Var4 = (_List_node_base *)plVar1;
    if (pHVar3->element->all == false) {
      do {
        p_Var4 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)&p_Var4->_M_next)
                 ->_M_impl)._M_node.super__List_node_base._M_next;
        bVar5 = p_Var4 == (_List_node_base *)plVar1;
        if (bVar5) {
          return bVar5;
        }
      } while (*(uint16_t *)&p_Var4[1]._M_next != srcport);
      return bVar5;
    }
    do {
      p_Var4 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)&p_Var4->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
      bVar5 = p_Var4 != (_List_node_base *)plVar1;
      if (p_Var4 == (_List_node_base *)plVar1) {
        return bVar5;
      }
    } while (*(uint16_t *)&p_Var4[1]._M_next != srcport);
    return bVar5;
  }
  while( true ) {
    if (pHVar3 == (HashElement *)0x0) {
      return false;
    }
    if (pHVar3->key == srcip) break;
    pHVar3 = pHVar3->hashnext;
    (this->acceptignoreinfo).curhashelem = pHVar3;
  }
  plVar1 = &pHVar3->element->portlist;
  p_Var4 = (_List_node_base *)plVar1;
  if (pHVar3->element->all == false) {
    do {
      p_Var4 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)&p_Var4->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
      bVar5 = p_Var4 != (_List_node_base *)plVar1;
      if (p_Var4 == (_List_node_base *)plVar1) {
        return bVar5;
      }
    } while (*(uint16_t *)&p_Var4[1]._M_next != srcport);
    return bVar5;
  }
  do {
    p_Var4 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)&p_Var4->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    bVar5 = p_Var4 == (_List_node_base *)plVar1;
    if (bVar5) {
      return bVar5;
    }
  } while (*(uint16_t *)&p_Var4[1]._M_next != srcport);
  return bVar5;
}

Assistant:

static int GetIndex(const uint32_t &k)							{ return k%RTPFAKETRANS_HASHSIZE; }